

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedjson.cpp
# Opt level: O1

bool __thiscall ParsedJson::printjson(ParsedJson *this,ostream *os)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  ostream *poVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  char local_56 [6];
  ParsedJson *local_50;
  ostream *local_48;
  void *local_40;
  ulong local_38;
  
  if (this->isvalid == true) {
    local_48 = os;
    if ((char)(*this->tape >> 0x38) == 'r') {
      uVar11 = *this->tape & 0xffffffffffffff;
      if (uVar11 <= this->tapecapacity) {
        uVar12 = this->depthcapacity;
        pvVar7 = operator_new__(uVar12);
        pvVar8 = operator_new__(-(ulong)(uVar12 >> 0x3d != 0) | uVar12 << 3);
        *(undefined8 *)((long)pvVar8 + 8) = 0;
        *(undefined1 *)((long)pvVar7 + 1) = 0;
        local_40 = pvVar7;
        if (1 < uVar11) {
          local_38 = 1;
          uVar12 = 1;
          local_50 = this;
          do {
            uVar2 = this->tape[uVar12];
            lVar9 = (long)(int)local_38;
            uVar3 = *(ulong *)((long)pvVar8 + lVar9 * 8);
            bVar4 = (byte)(uVar2 >> 0x38);
            if (*(char *)((long)local_40 + lVar9) == '\0') {
              if ((uVar3 != 0) && (pcVar10 = ",", bVar4 != 0x5d)) goto LAB_0010799f;
            }
            else {
              if ((uVar3 != 0) && (((uVar3 & 1) == 0 && (bVar4 != 0x7d)))) {
                std::__ostream_insert<char,std::char_traits<char>>(local_48,",",1);
              }
              pcVar10 = ":";
              if ((*(byte *)((long)pvVar8 + lVar9 * 8) & 1) != 0) {
LAB_0010799f:
                std::__ostream_insert<char,std::char_traits<char>>(local_48,pcVar10,1);
              }
            }
            poVar6 = local_48;
            this = local_50;
            plVar1 = (long *)((long)pvVar8 + lVar9 * 8);
            *plVar1 = *plVar1 + 1;
            if (bVar4 < 0x6c) {
              if (0x5c < bVar4) {
                if (bVar4 == 0x5d) {
                  local_38 = (ulong)((int)local_38 - 1);
                  local_56[5] = 0x5d;
                  lVar9 = 1;
                  pcVar10 = local_56 + 5;
                }
                else {
                  if (bVar4 == 100) {
                    if (uVar11 <= uVar12 + 1) goto LAB_00107b5d;
                    std::ostream::_M_insert<double>((double)local_50->tape[uVar12 + 1]);
                    goto LAB_00107b56;
                  }
                  if (bVar4 != 0x66) goto switchD_001079d1_caseD_6d;
                  lVar9 = 5;
                  pcVar10 = "false";
                }
                goto LAB_00107b93;
              }
              if (bVar4 == 0x22) {
                local_56[0] = '\"';
                std::__ostream_insert<char,std::char_traits<char>>(local_48,local_56,1);
                this = local_50;
                print_with_escapes(local_50->string_buf + (uVar2 & 0xffffffffffffff));
                local_56[1] = 0x22;
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_56 + 1,1);
                bVar5 = true;
                goto LAB_00107bd6;
              }
              if (bVar4 == 0x5b) {
                local_56[4] = 0x5b;
                std::__ostream_insert<char,std::char_traits<char>>(local_48,local_56 + 4,1);
                *(undefined1 *)((long)local_40 + lVar9 + 1) = 0;
                goto LAB_00107bc6;
              }
switchD_001079d1_caseD_6d:
              bVar5 = false;
              fprintf(_stderr,"bug %c\n",uVar2 >> 0x38);
              operator_delete__(local_40);
              operator_delete__(pvVar8);
              this = local_50;
              goto LAB_00107bd6;
            }
            switch(bVar4) {
            case 0x6c:
              if (uVar11 <= uVar12 + 1) {
LAB_00107b5d:
                operator_delete__(local_40);
                operator_delete__(pvVar8);
                goto LAB_00107b6f;
              }
              std::ostream::_M_insert<long>((long)local_48);
LAB_00107b56:
              uVar12 = uVar12 + 1;
              bVar5 = true;
              break;
            case 0x6d:
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
              goto switchD_001079d1_caseD_6d;
            case 0x6e:
              lVar9 = 4;
              pcVar10 = "null";
              goto LAB_00107b93;
            case 0x72:
              printjson();
LAB_00107b6f:
              bVar5 = false;
              this = local_50;
              break;
            case 0x74:
              lVar9 = 4;
              pcVar10 = "true";
LAB_00107b93:
              std::__ostream_insert<char,std::char_traits<char>>(local_48,pcVar10,lVar9);
LAB_00107bcf:
              bVar5 = true;
              this = local_50;
              break;
            default:
              if (bVar4 != 0x7b) {
                if (bVar4 == 0x7d) {
                  local_38 = (ulong)((int)local_38 - 1);
                  local_56[3] = 0x7d;
                  lVar9 = 1;
                  pcVar10 = local_56 + 3;
                  goto LAB_00107b93;
                }
                goto switchD_001079d1_caseD_6d;
              }
              local_56[2] = 0x7b;
              std::__ostream_insert<char,std::char_traits<char>>(local_48,local_56 + 2,1);
              *(undefined1 *)((long)local_40 + lVar9 + 1) = 1;
LAB_00107bc6:
              local_38 = lVar9 + 1;
              *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 8) = 0;
              goto LAB_00107bcf;
            }
LAB_00107bd6:
            if (!bVar5) {
              return false;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar11);
        }
        operator_delete__(local_40);
        operator_delete__(pvVar8);
        return true;
      }
      printjson();
    }
    else {
      printjson();
    }
  }
  return false;
}

Assistant:

WARN_UNUSED
bool ParsedJson::printjson(std::ostream &os) {
    if(!isvalid) { 
      return false;
    }
    size_t tapeidx = 0;
    uint64_t tape_val = tape[tapeidx];
    uint8_t type = (tape_val >> 56);
    size_t howmany = 0;
    if (type == 'r') {
      howmany = tape_val & JSONVALUEMASK;
    } else {
      fprintf(stderr, "Error: no starting root node?");
      return false;
    }
    if (howmany > tapecapacity) {
      fprintf(stderr,
          "We may be exceeding the tape capacity. Is this a valid document?\n");
      return false;
    }
    tapeidx++;
    bool *inobject = new bool[depthcapacity];
    auto *inobjectidx = new size_t[depthcapacity];
    int depth = 1; // only root at level 0
    inobjectidx[depth] = 0;
    inobject[depth] = false;
    for (; tapeidx < howmany; tapeidx++) {
      tape_val = tape[tapeidx];
      uint64_t payload = tape_val & JSONVALUEMASK;
      type = (tape_val >> 56);
      if (!inobject[depth]) {
        if ((inobjectidx[depth] > 0) && (type != ']')) {
          os << ",";
        }
        inobjectidx[depth]++;
      } else { // if (inobject) {
        if ((inobjectidx[depth] > 0) && ((inobjectidx[depth] & 1) == 0) &&
            (type != '}')) {
          os << ",";
        }
        if (((inobjectidx[depth] & 1) == 1)) {
          os << ":";
        }
        inobjectidx[depth]++;
      }
      switch (type) {
      case '"': // we have a string
        os << '"';
        print_with_escapes((const unsigned char *)(string_buf + payload));
        os << '"';
        break;
      case 'l': // we have a long int
        if (tapeidx + 1 >= howmany) {
          delete[] inobject;
          delete[] inobjectidx;
          return false;
        }
        os <<  static_cast<int64_t>(tape[++tapeidx]);
        break;
      case 'd': // we have a double
        if (tapeidx + 1 >= howmany){
          delete[] inobject;
          delete[] inobjectidx;
          return false;
        }
        double answer;
        memcpy(&answer, &tape[++tapeidx], sizeof(answer));
        os << answer;
        break;
      case 'n': // we have a null
        os << "null";
        break;
      case 't': // we have a true
        os << "true";
        break;
      case 'f': // we have a false
        os << "false";
        break;
      case '{': // we have an object
        os << '{';
        depth++;
        inobject[depth] = true;
        inobjectidx[depth] = 0;
        break;
      case '}': // we end an object
        depth--;
        os << '}';
        break;
      case '[': // we start an array
        os << '[';
        depth++;
        inobject[depth] = false;
        inobjectidx[depth] = 0;
        break;
      case ']': // we end an array
        depth--;
        os << ']';
        break;
      case 'r': // we start and end with the root node
        fprintf(stderr, "should we be hitting the root node?\n");
        delete[] inobject;
        delete[] inobjectidx;
        return false;
      default:
        fprintf(stderr, "bug %c\n", type);
        delete[] inobject;
        delete[] inobjectidx;
        return false;
      }
    }
    delete[] inobject;
    delete[] inobjectidx;
    return true;
}